

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O3

void mp::
     WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::SinId>
               (MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *jw,
               CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinId>
               *cfc)

{
  uint uVar1;
  string_view key;
  string_view key_00;
  string_view key_01;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_68;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_58;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_48;
  ulong local_38 [3];
  
  uVar1 = (cfc->super_FunctionalConstraint).result_var_;
  key._M_str = (char *)0x7;
  key._M_len = (size_t)jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_68,key);
  if (local_68.kind_ == Unset) {
    local_68.kind_ = Scalar;
  }
  local_38[0] = (ulong)uVar1;
  fmt::BasicWriter<char>::write
            (&(local_68.wrt_)->super_BasicWriter<char>,0x4baf35,(void *)0x2,(size_t)local_38);
  local_68.n_written_ = local_68.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_68);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_68);
  key_00._M_str = (char *)0x4;
  key_00._M_len = (size_t)jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_58,key_00)
  ;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator<<
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&local_58,
             (int *)&cfc->
                     super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::SinId>
            );
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
  key_01._M_str = (char *)0x6;
  key_01._M_len = (size_t)jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_48,key_01)
  ;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_48);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_48);
  return;
}

Assistant:

inline void WriteJSON(JW jw,
                      const CustomFunctionalConstraint<A,P,N,I>& cfc) {
  jw["res_var"] = cfc.GetResultVar();
  WriteJSON(jw["args"], cfc.GetArguments());
  WriteJSON(jw["params"], cfc.GetParameters());
}